

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_narrow_sat_s8_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  undefined2 uVar1;
  undefined3 uVar2;
  byte bVar3;
  byte local_1b;
  uint32_t res;
  uint8_t d;
  int16_t s;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  local_1b = (byte)x;
  if ((int)(short)x != (int)(char)local_1b) {
    local_1b = (char)(x >> 8) >> 7 ^ 0x7f;
    (env->vfp).qc[0] = 1;
  }
  bVar3 = local_1b;
  local_1b = (byte)(x >> 0x10);
  if ((int)(short)(x >> 0x10) != (int)(char)local_1b) {
    local_1b = (char)(x >> 0x18) >> 7 ^ 0x7f;
    (env->vfp).qc[0] = 1;
  }
  uVar1 = CONCAT11(local_1b,bVar3);
  local_1b = (byte)(x >> 0x20);
  if ((int)(short)(x >> 0x20) != (int)(char)local_1b) {
    local_1b = (char)(x >> 0x28) >> 7 ^ 0x7f;
    (env->vfp).qc[0] = 1;
  }
  uVar2 = CONCAT12(local_1b,uVar1);
  local_1b = (byte)(x >> 0x30);
  if ((int)(short)(x >> 0x30) != (int)(char)local_1b) {
    local_1b = (byte)((long)x >> 0x3f) ^ 0x7f;
    (env->vfp).qc[0] = 1;
  }
  return CONCAT13(local_1b,uVar2);
}

Assistant:

uint32_t HELPER(neon_narrow_sat_s8)(CPUARMState *env, uint64_t x)
{
    int16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s != (int8_t)s) { \
        d = (s >> 15) ^ 0x7f; \
        SET_QC(); \
    } else  { \
        d = s; \
    } \
    res |= (uint32_t)d << (n / 2);

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}